

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O1

FT_UInt32 ps_unicodes_char_next(PS_Unicodes table,FT_UInt32 *unicode)

{
  uint uVar1;
  PS_UniMap *pPVar2;
  FT_UInt32 FVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar4 = *unicode + 1;
  uVar1 = table->num_maps;
  if (uVar1 == 0) {
    uVar8 = 0;
    FVar3 = 0;
  }
  else {
    pPVar2 = table->maps;
    FVar3 = 0;
    uVar8 = 0;
    uVar6 = uVar1;
    do {
      uVar7 = (uVar6 - uVar8 >> 1) + uVar8;
      if (pPVar2[uVar7].unicode == uVar4) {
        FVar3 = pPVar2[uVar7].glyph_index;
        goto LAB_0021653a;
      }
      uVar5 = pPVar2[uVar7].unicode & 0x7fffffff;
      if (uVar5 == uVar4) {
        FVar3 = pPVar2[uVar7].glyph_index;
      }
      if (uVar5 < uVar4) {
        uVar8 = uVar7 + 1;
        uVar7 = uVar6;
      }
      uVar6 = uVar7;
    } while (uVar8 < uVar6);
  }
  if (FVar3 == 0) {
    uVar4 = 0;
    FVar3 = 0;
    if (uVar8 < uVar1) {
      FVar3 = table->maps[uVar8].glyph_index;
      uVar4 = table->maps[uVar8].unicode & 0x7fffffff;
    }
  }
LAB_0021653a:
  *unicode = uVar4;
  return FVar3;
}

Assistant:

static FT_UInt32
  ps_unicodes_char_next( PS_Unicodes  table,
                         FT_UInt32   *unicode )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *unicode + 1;


    {
      FT_UInt     min = 0;
      FT_UInt     max = table->num_maps;
      FT_UInt     mid;
      PS_UniMap*  map;
      FT_UInt32   base_glyph;


      while ( min < max )
      {
        mid = min + ( ( max - min ) >> 1 );
        map = table->maps + mid;

        if ( map->unicode == char_code )
        {
          result = map->glyph_index;
          goto Exit;
        }

        base_glyph = BASE_GLYPH( map->unicode );

        if ( base_glyph == char_code )
          result = map->glyph_index;

        if ( base_glyph < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      if ( result )
        goto Exit;               /* we have a variant glyph */

      /* we didn't find it; check whether we have a map just above it */
      char_code = 0;

      if ( min < table->num_maps )
      {
        map       = table->maps + min;
        result    = map->glyph_index;
        char_code = BASE_GLYPH( map->unicode );
      }
    }

  Exit:
    *unicode = char_code;
    return result;
  }